

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void build_masked_compound_no_round
               (uint8_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1,
               int src1_stride,INTERINTER_COMPOUND_DATA *comp_data,BLOCK_SIZE sb_type,int h,int w,
               InterPredParams *inter_pred_params)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint32_t in_ECX;
  CONV_BUF_TYPE *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  CONV_BUF_TYPE *in_R8;
  uint32_t in_R9D;
  byte in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  int mask_stride;
  uint8_t *mask;
  int ssx;
  int ssy;
  INTERINTER_COMPOUND_DATA *in_stack_ffffffffffffff48;
  
  iVar1 = *(int *)(in_stack_00000028 + 0xa4);
  iVar2 = *(int *)(in_stack_00000028 + 0xa0);
  puVar3 = av1_get_compound_type_mask(in_stack_ffffffffffffff48,BLOCK_4X4);
  if (*(int *)(in_stack_00000028 + 0xb4) == 0) {
    (*aom_lowbd_blend_a64_d16_mask)
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,puVar3,
               (uint32_t)block_size_wide[in_stack_00000010],in_stack_00000020,in_stack_00000018,
               iVar2,iVar1,(ConvolveParams *)(in_stack_00000028 + 0x30));
  }
  else {
    (*aom_highbd_blend_a64_d16_mask)
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,puVar3,
               (uint32_t)block_size_wide[in_stack_00000010],in_stack_00000020,in_stack_00000018,
               iVar2,iVar1,(ConvolveParams *)(in_stack_00000028 + 0x30),
               *(int *)(in_stack_00000028 + 0xb0));
  }
  return;
}

Assistant:

static inline void build_masked_compound_no_round(
    uint8_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride,
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE sb_type, int h,
    int w, InterPredParams *inter_pred_params) {
  const int ssy = inter_pred_params->subsampling_y;
  const int ssx = inter_pred_params->subsampling_x;
  const uint8_t *mask = av1_get_compound_type_mask(comp_data, sb_type);
  const int mask_stride = block_size_wide[sb_type];
#if CONFIG_AV1_HIGHBITDEPTH
  if (inter_pred_params->use_hbd_buf) {
    aom_highbd_blend_a64_d16_mask(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h, ssx,
                                  ssy, &inter_pred_params->conv_params,
                                  inter_pred_params->bit_depth);
  } else {
    aom_lowbd_blend_a64_d16_mask(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, w, h, ssx, ssy,
                                 &inter_pred_params->conv_params);
  }
#else
  aom_lowbd_blend_a64_d16_mask(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, mask_stride, w, h, ssx, ssy,
                               &inter_pred_params->conv_params);
#endif
}